

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void __thiscall
mxx::custom_op<int>::custom_op<int(*)(int,int)>
          (custom_op<int> *this,_func_int_int_int *func,bool commutative)

{
  MPI_Op poVar1;
  MPI_Datatype poVar2;
  int local_7c;
  undefined1 local_78 [8];
  datatype dt_1;
  undefined1 local_50 [8];
  datatype dt;
  MPI_Op op;
  _func_int_int_int *p_Stack_18;
  bool commutative_local;
  _func_int_int_int *func_local;
  custom_op<int> *this_local;
  
  this->_vptr_custom_op = (_func_int **)&PTR__custom_op_0019aad0;
  p_Stack_18 = func;
  func_local = (_func_int_int_int *)this;
  std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::function(&this->m_user_func);
  this->m_builtin = false;
  poVar1 = get_builtin_op<int,_int_(*)(int,_int)>::op(p_Stack_18);
  if (poVar1 != (MPI_Op)&ompi_mpi_op_null) {
    this->m_builtin = true;
    this->m_op = poVar1;
    get_datatype<int>();
    poVar2 = mxx::datatype::type((datatype *)local_50);
    this->m_type_copy = poVar2;
    mxx::datatype::~datatype((datatype *)local_50);
  }
  if ((this->m_builtin & 1U) == 0) {
    std::
    bind<void(&)(int(*)(int,int),void*,void*,int*,ompi_datatype_t**),int(*)(int,int),std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&>
              ((_func_void__func_int_int_int_ptr_void_ptr_void_ptr_int_ptr_ompi_datatype_t_ptr_ptr *
               )&dt_1.builtin,(_func_int_int_int **)custom_function<int(*)(int,int)>,
               (_Placeholder<1> *)&stack0xffffffffffffffe8,(_Placeholder<2> *)&std::placeholders::_1
               ,(_Placeholder<3> *)&std::placeholders::_2,(_Placeholder<4> *)&std::placeholders::_3)
    ;
    std::function<void(void*,void*,int*,ompi_datatype_t**)>::operator=
              ((function<void(void*,void*,int*,ompi_datatype_t**)> *)&this->m_user_func,
               (_Bind<void_(*(int_(*)(int,_int),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(int_(*)(int,_int),_void_*,_void_*,_int_*,_ompi_datatype_t_**)>
                *)&dt_1.builtin);
    get_datatype<int>();
    poVar2 = mxx::datatype::type((datatype *)local_78);
    MPI_Type_dup(poVar2,&this->m_type_copy);
    local_7c = 0x543;
    attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
              (&this->m_type_copy,&local_7c,&this->m_user_func);
    MPI_Op_create(mpi_user_function,commutative,&this->m_op);
    mxx::datatype::~datatype((datatype *)local_78);
  }
  return;
}

Assistant:

custom_op(Func func, const bool commutative = true) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            namespace ph = std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                   std::forward<Func>(func),
                                   ph::_1, ph::_2, ph::_3, ph::_4);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, commutative, &m_op);
        }
    }